

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  undefined8 uVar5;
  Mat *m;
  Mat *this_00;
  pointer pMVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  _func_int *p_Var19;
  int iVar20;
  size_t b;
  int q;
  ulong uVar21;
  pointer pMVar22;
  int q_1;
  int iVar23;
  int iVar24;
  int iVar25;
  Mat *pMVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  float local_b8;
  float fStack_b4;
  Mat local_a0;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar24 = m->elempack;
  iVar17 = m->c;
  iVar16 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar25 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var19 = this->_vptr_Eltwise_x86[-3];
    iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var19);
    if (iVar24 == 4) {
      if (iVar25 == 0) {
        local_58 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start + 1;
        iVar25 = 0;
        iVar24 = 0;
        if (0 < iVar16) {
          iVar24 = iVar16;
        }
        iVar23 = 0;
        if (0 < iVar17) {
          iVar23 = iVar17;
        }
        for (; iVar25 != iVar23; iVar25 = iVar25 + 1) {
          Mat::channel(&local_a0,m,iVar25);
          pvVar13 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,local_58,iVar25);
          pvVar14 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar25);
          pvVar15 = local_a0.data;
          Mat::~Mat(&local_a0);
          lVar18 = 0;
          iVar20 = iVar24;
          while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
            pfVar2 = (float *)((long)pvVar14 + lVar18);
            fVar4 = pfVar2[1];
            fVar7 = pfVar2[2];
            fVar8 = pfVar2[3];
            pfVar3 = (float *)((long)pvVar13 + lVar18);
            fVar9 = pfVar3[1];
            fVar10 = pfVar3[2];
            fVar11 = pfVar3[3];
            pfVar1 = (float *)((long)pvVar15 + lVar18);
            *pfVar1 = *pfVar2 * *pfVar3;
            pfVar1[1] = fVar4 * fVar9;
            pfVar1[2] = fVar7 * fVar10;
            pfVar1[3] = fVar8 * fVar11;
            lVar18 = lVar18 + 0x10;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (iVar25 = 0; iVar25 != iVar23; iVar25 = iVar25 + 1) {
            Mat::channel(&local_a0,pMVar22 + uVar21,iVar25);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar25);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            iVar20 = iVar24;
            while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
              pfVar1 = (float *)((long)pvVar13 + lVar18);
              fVar4 = pfVar1[1];
              fVar7 = pfVar1[2];
              fVar8 = pfVar1[3];
              pfVar2 = (float *)((long)pvVar14 + lVar18);
              fVar9 = pfVar2[1];
              fVar10 = pfVar2[2];
              fVar11 = pfVar2[3];
              pfVar3 = (float *)((long)pvVar14 + lVar18);
              *pfVar3 = *pfVar1 * *pfVar2;
              pfVar3[1] = fVar4 * fVar9;
              pfVar3[2] = fVar7 * fVar10;
              pfVar3[3] = fVar8 * fVar11;
              lVar18 = lVar18 + 0x10;
            }
          }
        }
        p_Var19 = this->_vptr_Eltwise_x86[-3];
        iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var19);
      }
      if (iVar25 == 1) {
        pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
          iVar24 = 0;
          if (0 < iVar16) {
            iVar24 = iVar16;
          }
          iVar25 = 0;
          iVar23 = 0;
          if (0 < iVar17) {
            iVar25 = iVar17;
            iVar23 = 0;
          }
          for (; iVar23 != iVar25; iVar23 = iVar23 + 1) {
            Mat::channel(&local_a0,m,iVar23);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,pMVar26,iVar23);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar23);
            pvVar15 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            iVar20 = iVar24;
            while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
              pfVar1 = (float *)((long)pvVar14 + lVar18);
              fVar4 = pfVar1[1];
              fVar7 = pfVar1[2];
              fVar8 = pfVar1[3];
              pfVar2 = (float *)((long)pvVar13 + lVar18);
              fVar9 = pfVar2[1];
              fVar10 = pfVar2[2];
              fVar11 = pfVar2[3];
              pfVar3 = (float *)((long)pvVar15 + lVar18);
              *pfVar3 = *pfVar1 + *pfVar2;
              pfVar3[1] = fVar4 + fVar9;
              pfVar3[2] = fVar7 + fVar10;
              pfVar3[3] = fVar8 + fVar11;
              lVar18 = lVar18 + 0x10;
            }
          }
          for (uVar21 = 2;
              pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48); uVar21 = uVar21 + 1) {
            for (iVar23 = 0; iVar23 != iVar25; iVar23 = iVar23 + 1) {
              Mat::channel(&local_a0,pMVar22 + uVar21,iVar23);
              pvVar13 = local_a0.data;
              Mat::~Mat(&local_a0);
              Mat::channel(&local_a0,this_00,iVar23);
              pvVar14 = local_a0.data;
              Mat::~Mat(&local_a0);
              lVar18 = 0;
              iVar20 = iVar24;
              while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
                pfVar1 = (float *)((long)pvVar13 + lVar18);
                fVar4 = pfVar1[1];
                fVar7 = pfVar1[2];
                fVar8 = pfVar1[3];
                pfVar2 = (float *)((long)pvVar14 + lVar18);
                fVar9 = pfVar2[1];
                fVar10 = pfVar2[2];
                fVar11 = pfVar2[3];
                pfVar3 = (float *)((long)pvVar14 + lVar18);
                *pfVar3 = *pfVar1 + *pfVar2;
                pfVar3[1] = fVar4 + fVar9;
                pfVar3[2] = fVar7 + fVar10;
                pfVar3[3] = fVar8 + fVar11;
                lVar18 = lVar18 + 0x10;
              }
            }
          }
        }
        else {
          fStack_50 = **(float **)(&this->field_0xd8 + (long)p_Var19);
          local_48 = (*(float **)(&this->field_0xd8 + (long)p_Var19))[1];
          iVar25 = 0;
          iVar24 = 0;
          if (0 < iVar16) {
            iVar24 = iVar16;
          }
          iVar23 = 0;
          if (0 < iVar17) {
            iVar23 = iVar17;
          }
          local_58 = (pointer)CONCAT44(fStack_50,fStack_50);
          fStack_4c = fStack_50;
          fStack_44 = local_48;
          fStack_40 = local_48;
          fStack_3c = local_48;
          for (; iVar25 != iVar23; iVar25 = iVar25 + 1) {
            Mat::channel(&local_a0,m,iVar25);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,pMVar26,iVar25);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar25);
            pvVar15 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            iVar20 = iVar24;
            while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
              pfVar3 = (float *)((long)pvVar13 + lVar18);
              fVar4 = pfVar3[1];
              fVar7 = pfVar3[2];
              fVar8 = pfVar3[3];
              pfVar1 = (float *)((long)pvVar14 + lVar18);
              fVar9 = pfVar1[1];
              fVar10 = pfVar1[2];
              fVar11 = pfVar1[3];
              pfVar2 = (float *)((long)pvVar15 + lVar18);
              *pfVar2 = *pfVar1 * local_48 + *pfVar3 * (float)local_58;
              pfVar2[1] = fVar9 * fStack_44 + fVar4 * local_58._4_4_;
              pfVar2[2] = fVar10 * fStack_40 + fVar7 * fStack_50;
              pfVar2[3] = fVar11 * fStack_3c + fVar8 * fStack_4c;
              lVar18 = lVar18 + 0x10;
            }
          }
          pMVar22 = (pointer)0x2;
          while (pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                pMVar22 < (pointer)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar6) / 0x48)) {
            fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86[-3]) +
                              (long)pMVar22 * 4);
            local_58 = pMVar22;
            for (iVar25 = 0; iVar25 != iVar23; iVar25 = iVar25 + 1) {
              Mat::channel(&local_a0,pMVar6 + (long)pMVar22,iVar25);
              pvVar13 = local_a0.data;
              Mat::~Mat(&local_a0);
              Mat::channel(&local_a0,this_00,iVar25);
              pvVar14 = local_a0.data;
              Mat::~Mat(&local_a0);
              lVar18 = 0;
              iVar20 = iVar24;
              while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
                pfVar1 = (float *)((long)pvVar13 + lVar18);
                fVar7 = pfVar1[1];
                fVar8 = pfVar1[2];
                fVar9 = pfVar1[3];
                pfVar2 = (float *)((long)pvVar14 + lVar18);
                fVar10 = pfVar2[1];
                fVar11 = pfVar2[2];
                fVar12 = pfVar2[3];
                pfVar3 = (float *)((long)pvVar14 + lVar18);
                *pfVar3 = *pfVar1 * fVar4 + *pfVar2;
                pfVar3[1] = fVar7 * fVar4 + fVar10;
                pfVar3[2] = fVar8 * fVar4 + fVar11;
                pfVar3[3] = fVar9 * fVar4 + fVar12;
                lVar18 = lVar18 + 0x10;
              }
            }
            pMVar22 = (pointer)((long)&local_58->data + 1);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 2) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar24 = 0;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        for (; iVar24 != iVar17; iVar24 = iVar24 + 1) {
          Mat::channel(&local_a0,m,iVar24);
          pvVar13 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,pMVar22 + 1,iVar24);
          pvVar14 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar24);
          pvVar15 = local_a0.data;
          Mat::~Mat(&local_a0);
          lVar18 = 0;
          iVar25 = iVar16;
          while (bVar27 = iVar25 != 0, iVar25 = iVar25 + -1, bVar27) {
            auVar28 = maxps(*(undefined1 (*) [16])((long)pvVar13 + lVar18),
                            *(undefined1 (*) [16])((long)pvVar14 + lVar18));
            *(undefined1 (*) [16])((long)pvVar15 + lVar18) = auVar28;
            lVar18 = lVar18 + 0x10;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (iVar24 = 0; iVar24 != iVar17; iVar24 = iVar24 + 1) {
            Mat::channel(&local_a0,pMVar22 + uVar21,iVar24);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar24);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            iVar25 = iVar16;
            while (bVar27 = iVar25 != 0, iVar25 = iVar25 + -1, bVar27) {
              auVar28 = maxps(*(undefined1 (*) [16])((long)pvVar14 + lVar18),
                              *(undefined1 (*) [16])((long)pvVar13 + lVar18));
              *(undefined1 (*) [16])((long)pvVar14 + lVar18) = auVar28;
              lVar18 = lVar18 + 0x10;
            }
          }
        }
      }
    }
    else {
      if (iVar25 == 0) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar25 = 0;
        iVar24 = 0;
        if (0 < iVar17) {
          iVar24 = iVar17;
        }
        for (; iVar25 != iVar24; iVar25 = iVar25 + 1) {
          Mat::channel(&local_a0,m,iVar25);
          pvVar13 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,pMVar22 + 1,iVar25);
          pvVar14 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar25);
          pvVar15 = local_a0.data;
          Mat::~Mat(&local_a0);
          lVar18 = 0;
          for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
            *(float *)((long)pvVar15 + lVar18) =
                 *(float *)((long)pvVar14 + lVar18) * *(float *)((long)pvVar13 + lVar18);
            lVar18 = lVar18 + 4;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (iVar25 = 0; iVar25 != iVar24; iVar25 = iVar25 + 1) {
            Mat::channel(&local_a0,pMVar22 + uVar21,iVar25);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar25);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
              *(float *)((long)pvVar14 + lVar18) =
                   *(float *)((long)pvVar14 + lVar18) * *(float *)((long)pvVar13 + lVar18);
              lVar18 = lVar18 + 4;
            }
          }
        }
        p_Var19 = this->_vptr_Eltwise_x86[-3];
        iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var19);
      }
      if (iVar25 == 1) {
        pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (*(int *)(&this->field_0x104 + (long)p_Var19) == 0) {
          iVar25 = 0;
          iVar24 = 0;
          if (0 < iVar17) {
            iVar24 = iVar17;
          }
          for (; iVar25 != iVar24; iVar25 = iVar25 + 1) {
            Mat::channel(&local_a0,m,iVar25);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,pMVar26,iVar25);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar25);
            pvVar15 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
              *(float *)((long)pvVar15 + lVar18) =
                   *(float *)((long)pvVar14 + lVar18) + *(float *)((long)pvVar13 + lVar18);
              lVar18 = lVar18 + 4;
            }
          }
          for (uVar21 = 2;
              pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48); uVar21 = uVar21 + 1) {
            for (iVar25 = 0; iVar25 != iVar24; iVar25 = iVar25 + 1) {
              Mat::channel(&local_a0,pMVar22 + uVar21,iVar25);
              pvVar13 = local_a0.data;
              Mat::~Mat(&local_a0);
              Mat::channel(&local_a0,this_00,iVar25);
              pvVar14 = local_a0.data;
              Mat::~Mat(&local_a0);
              lVar18 = 0;
              for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
                *(float *)((long)pvVar14 + lVar18) =
                     *(float *)((long)pvVar14 + lVar18) + *(float *)((long)pvVar13 + lVar18);
                lVar18 = lVar18 + 4;
              }
            }
          }
        }
        else {
          uVar5 = **(undefined8 **)(&this->field_0xd8 + (long)p_Var19);
          iVar25 = 0;
          iVar24 = 0;
          if (0 < iVar17) {
            iVar24 = iVar17;
          }
          for (; iVar25 != iVar24; iVar25 = iVar25 + 1) {
            Mat::channel(&local_a0,m,iVar25);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,pMVar26,iVar25);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar25);
            pvVar15 = local_a0.data;
            Mat::~Mat(&local_a0);
            local_b8 = (float)uVar5;
            fStack_b4 = (float)((ulong)uVar5 >> 0x20);
            lVar18 = 0;
            for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
              *(float *)((long)pvVar15 + lVar18) =
                   *(float *)((long)pvVar14 + lVar18) * fStack_b4 +
                   *(float *)((long)pvVar13 + lVar18) * local_b8;
              lVar18 = lVar18 + 4;
            }
          }
          for (uVar21 = 2;
              pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start,
              uVar21 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                              0x48); uVar21 = uVar21 + 1) {
            fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)this->_vptr_Eltwise_x86[-3]) +
                              uVar21 * 4);
            for (iVar25 = 0; iVar25 != iVar24; iVar25 = iVar25 + 1) {
              Mat::channel(&local_a0,pMVar22 + uVar21,iVar25);
              pvVar13 = local_a0.data;
              Mat::~Mat(&local_a0);
              Mat::channel(&local_a0,this_00,iVar25);
              pvVar14 = local_a0.data;
              Mat::~Mat(&local_a0);
              lVar18 = 0;
              for (iVar23 = iVar16; 0 < iVar23; iVar23 = iVar23 + -1) {
                *(float *)((long)pvVar14 + lVar18) =
                     *(float *)((long)pvVar13 + lVar18) * fVar4 + *(float *)((long)pvVar14 + lVar18)
                ;
                lVar18 = lVar18 + 4;
              }
            }
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86[-3]) == 2) {
        pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar24 = 0;
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        for (; iVar24 != iVar17; iVar24 = iVar24 + 1) {
          Mat::channel(&local_a0,m,iVar24);
          pvVar13 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,pMVar22 + 1,iVar24);
          pvVar14 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar24);
          pvVar15 = local_a0.data;
          Mat::~Mat(&local_a0);
          lVar18 = 0;
          for (iVar25 = iVar16; 0 < iVar25; iVar25 = iVar25 + -1) {
            fVar4 = *(float *)((long)pvVar14 + lVar18);
            if (*(float *)((long)pvVar14 + lVar18) <= *(float *)((long)pvVar13 + lVar18)) {
              fVar4 = *(float *)((long)pvVar13 + lVar18);
            }
            *(float *)((long)pvVar15 + lVar18) = fVar4;
            lVar18 = lVar18 + 4;
          }
        }
        for (uVar21 = 2;
            pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar21 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar22) /
                            0x48); uVar21 = uVar21 + 1) {
          for (iVar24 = 0; iVar24 != iVar17; iVar24 = iVar24 + 1) {
            Mat::channel(&local_a0,pMVar22 + uVar21,iVar24);
            pvVar13 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar24);
            pvVar14 = local_a0.data;
            Mat::~Mat(&local_a0);
            lVar18 = 0;
            for (iVar25 = iVar16; 0 < iVar25; iVar25 = iVar25 + -1) {
              fVar4 = *(float *)((long)pvVar14 + lVar18);
              if (fVar4 <= *(float *)((long)pvVar13 + lVar18)) {
                fVar4 = *(float *)((long)pvVar13 + lVar18);
              }
              *(float *)((long)pvVar14 + lVar18) = fVar4;
              lVar18 = lVar18 + 4;
            }
          }
        }
      }
    }
    iVar25 = 0;
  }
  return iVar25;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}